

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::WriteIndent(VmaJsonWriter *this,bool oneLess)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  sVar1 = (this->m_Stack).m_Count;
  if ((sVar1 != 0) && ((this->m_Stack).m_pArray[sVar1 - 1].singleLineMode == false)) {
    VmaStringBuilder::AddNewLine(this->m_SB);
    sVar1 = (this->m_Stack).m_Count;
    if (sVar1 != 0) {
      lVar2 = sVar1 - oneLess;
      while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
        VmaStringBuilder::Add(this->m_SB,"  ");
      }
    }
  }
  return;
}

Assistant:

size_t size() const { return m_Count; }